

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCTestResourceSpec.cxx
# Opt level: O0

int testCTestResourceSpec(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string path;
  ExpectedSpec *spec;
  const_iterator __end1;
  const_iterator __begin1;
  vector<ExpectedSpec,_std::allocator<ExpectedSpec>_> *__range1;
  int retval;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    std::operator<<((ostream *)&std::cout,"Invalid arguments.\n");
    argv_local._4_4_ = -1;
  }
  else {
    __range1._4_4_ = 0;
    __end1 = std::vector<ExpectedSpec,_std::allocator<ExpectedSpec>_>::begin(&expectedResourceSpecs)
    ;
    spec = (ExpectedSpec *)
           std::vector<ExpectedSpec,_std::allocator<ExpectedSpec>_>::end(&expectedResourceSpecs);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<const_ExpectedSpec_*,_std::vector<ExpectedSpec,_std::allocator<ExpectedSpec>_>_>
                                  *)&spec);
      if (!bVar1) break;
      path.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_ExpectedSpec_*,_std::vector<ExpectedSpec,_std::allocator<ExpectedSpec>_>_>
           ::operator*(&__end1);
      __s = argv[1];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_60,__s,&local_61);
      std::allocator<char>::~allocator(&local_61);
      std::__cxx11::string::operator+=((string *)local_60,"/testCTestResourceSpec_data/");
      std::__cxx11::string::operator+=((string *)local_60,(string *)path.field_2._8_8_);
      bVar1 = testSpec((string *)local_60,*(ReadFileResult *)(path.field_2._8_8_ + 0x20),
                       (cmCTestResourceSpec *)(path.field_2._8_8_ + 0x28));
      if (!bVar1) {
        __range1._4_4_ = -1;
      }
      std::__cxx11::string::~string((string *)local_60);
      __gnu_cxx::
      __normal_iterator<const_ExpectedSpec_*,_std::vector<ExpectedSpec,_std::allocator<ExpectedSpec>_>_>
      ::operator++(&__end1);
    }
    argv_local._4_4_ = __range1._4_4_;
  }
  return argv_local._4_4_;
}

Assistant:

int testCTestResourceSpec(int argc, char** const argv)
{
  if (argc < 2) {
    std::cout << "Invalid arguments.\n";
    return -1;
  }

  int retval = 0;
  for (auto const& spec : expectedResourceSpecs) {
    std::string path = argv[1];
    path += "/testCTestResourceSpec_data/";
    path += spec.Path;
    if (!testSpec(path, spec.ParseResult, spec.Expected)) {
      retval = -1;
    }
  }

  return retval;
}